

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O1

int __thiscall smf::Options::getInt(Options *this,string *optionName)

{
  long lVar1;
  string local_30;
  
  getString(&local_30,this,optionName);
  lVar1 = strtol(local_30._M_dataplus._M_p,(char **)0x0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return (int)lVar1;
}

Assistant:

int Options::getInt(const std::string& optionName) {
   return (int)strtol(getString(optionName).c_str(), (char**)NULL, 0);
}